

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Object.cpp
# Opt level: O0

int Lodtalk::Object::stAt(InterpreterProxy *interpreter)

{
  int iVar1;
  uint uVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  SmallIntegerValue SVar3;
  long lVar4;
  undefined4 extraout_var_04;
  void *pvVar5;
  Oop OVar6;
  uint64_t *data_3;
  uint32_t *data_2;
  uint16_t *data_1;
  uint8_t *data;
  Oop *oopData;
  uint format;
  void *firstIndexableField;
  VMContext *context;
  SmallIntegerValue index;
  long local_40;
  SmallIntegerValue size;
  Oop indexOop;
  Oop self;
  int error;
  InterpreterProxy *interpreter_local;
  
  iVar1 = (*interpreter->_vptr_InterpreterProxy[0x1a])();
  if (CONCAT44(extraout_var,iVar1) == 1) {
    iVar1 = (*interpreter->_vptr_InterpreterProxy[0xb])();
    (*interpreter->_vptr_InterpreterProxy[1])(interpreter,CONCAT44(extraout_var_00,iVar1));
    interpreter_local._4_4_ = stSize(interpreter);
    if (interpreter_local._4_4_ == 0) {
      indexOop.field_0._0_4_ = (*interpreter->_vptr_InterpreterProxy[0xb])();
      indexOop.field_0.uintValue._4_4_ = extraout_var_01;
      iVar1 = (*interpreter->_vptr_InterpreterProxy[0x1c])(interpreter,0);
      size = CONCAT44(extraout_var_02,iVar1);
      iVar1 = (*interpreter->_vptr_InterpreterProxy[6])();
      index = CONCAT44(extraout_var_03,iVar1);
      local_40 = Oop::decodeSmallInteger((Oop *)&index);
      SVar3 = Oop::decodeSmallInteger((Oop *)&size);
      lVar4 = SVar3 + -1;
      if ((local_40 < lVar4) || (lVar4 < 0)) {
        interpreter_local._4_4_ = (*interpreter->_vptr_InterpreterProxy[0x1e])();
      }
      else {
        iVar1 = (**interpreter->_vptr_InterpreterProxy)();
        pvVar5 = Oop::getFirstIndexableFieldPointer
                           (&indexOop,(VMContext *)CONCAT44(extraout_var_04,iVar1));
        uVar2 = (uint)((ulong)*(undefined8 *)indexOop.field_0 >> 0x23) & 0x1f;
        if (uVar2 < 9) {
          interpreter_local._4_4_ =
               (*interpreter->_vptr_InterpreterProxy[0x17])
                         (interpreter,*(undefined8 *)((long)pvVar5 + lVar4 * 8));
        }
        else if (uVar2 < 0x10) {
          if (uVar2 < 0xc) {
            if (uVar2 < 10) {
              if (uVar2 == 9) {
                OVar6 = VMContext::positiveInt64ObjectFor
                                  ((VMContext *)CONCAT44(extraout_var_04,iVar1),
                                   *(uint64_t *)((long)pvVar5 + lVar4 * 8));
                interpreter_local._4_4_ =
                     (*interpreter->_vptr_InterpreterProxy[0x17])(interpreter,OVar6.field_0);
              }
              else {
                interpreter_local._4_4_ = (*interpreter->_vptr_InterpreterProxy[0x1e])();
              }
            }
            else {
              OVar6 = Oop::encodeSmallInteger((ulong)*(uint *)((long)pvVar5 + lVar4 * 4));
              interpreter_local._4_4_ =
                   (*interpreter->_vptr_InterpreterProxy[0x17])(interpreter,OVar6.field_0);
            }
          }
          else {
            OVar6 = Oop::encodeSmallInteger((ulong)*(ushort *)((long)pvVar5 + lVar4 * 2));
            interpreter_local._4_4_ =
                 (*interpreter->_vptr_InterpreterProxy[0x17])(interpreter,OVar6.field_0);
          }
        }
        else {
          OVar6 = Oop::encodeSmallInteger((ulong)*(byte *)((long)pvVar5 + lVar4));
          interpreter_local._4_4_ =
               (*interpreter->_vptr_InterpreterProxy[0x17])(interpreter,OVar6.field_0);
        }
      }
    }
  }
  else {
    interpreter_local._4_4_ = (*interpreter->_vptr_InterpreterProxy[0x1e])();
  }
  return interpreter_local._4_4_;
}

Assistant:

int Object::stAt(InterpreterProxy *interpreter)
{
    if(interpreter->getArgumentCount() != 1)
        return interpreter->primitiveFailed();

    interpreter->pushOop(interpreter->getReceiver());
    auto error = stSize(interpreter);
    if(error != 0)
        return error;

    Oop self = interpreter->getReceiver();
    Oop indexOop = interpreter->getTemporary(0);
    auto size = interpreter->popOop().decodeSmallInteger();
	auto index = indexOop.decodeSmallInteger() - 1;
	if(index > size || index < 0)
		return interpreter->primitiveFailed();

    // Get the element.
    auto context = interpreter->getContext();
    auto firstIndexableField = self.getFirstIndexableFieldPointer(context);
    auto format = self.header->objectFormat;
    if(format < OF_INDEXABLE_64)
    {
        auto oopData = reinterpret_cast<Oop*> (firstIndexableField);
        return interpreter->returnOop(oopData[index]);
    }

    if(format >= OF_INDEXABLE_8)
    {
        auto data = reinterpret_cast<uint8_t*> (firstIndexableField);
        return interpreter->returnOop(Oop::encodeSmallInteger(data[index]));
    }

    if(format >= OF_INDEXABLE_16)
    {
        auto data = reinterpret_cast<uint16_t*> (firstIndexableField);
        return interpreter->returnOop(Oop::encodeSmallInteger(data[index]));
    }

    if(format >= OF_INDEXABLE_32)
    {
        auto data = reinterpret_cast<uint32_t*> (firstIndexableField);
#ifdef OBJECT_MODEL_SPUR_64
        return interpreter->returnOop(Oop::encodeSmallInteger(data[index]));
#else
        return interpreter->returnOop(context->positiveInt32ObjectFor(data[index]));
#endif
    }

    if(format == OF_INDEXABLE_64)
    {
        auto data = reinterpret_cast<uint64_t*> (firstIndexableField);
        return interpreter->returnOop(context->positiveInt64ObjectFor(data[index]));
    }

    // Should not reach here.
    return interpreter->primitiveFailed();
}